

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O0

void __thiscall
gmath::IDWNode::get(IDWNode *this,uint _x,uint _y,float *nominator,float *denominator)

{
  float *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  float *in_R8;
  float fVar1;
  float fVar2;
  float fVar3;
  int i;
  float v;
  float l2;
  float yd;
  float xd;
  undefined4 local_34;
  
  fVar1 = (float)in_ESI - *(float *)(in_RDI + 0x10);
  fVar2 = (float)in_EDX - *(float *)(in_RDI + 0x14);
  fVar3 = fVar1 * fVar1 + fVar2 * fVar2;
  if ((*(int *)(in_RDI + 0x18) == 1) || (*(float *)(in_RDI + 0xc) <= fVar3)) {
    if (fVar3 <= 0.0) {
      *in_RCX = *(float *)(in_RDI + 0x1c) * 1e+06;
      *in_R8 = 1e+06;
    }
    else {
      fVar3 = (*(float *)(in_RDI + 0x20) * (float)*(int *)(in_RDI + 0x18)) / fVar3;
      *in_RCX = fVar3 * *(float *)(in_RDI + 0x1c) + *in_RCX;
      *in_R8 = fVar3 + *in_R8;
    }
  }
  else {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      if (*(long *)(in_RDI + 0x28 + (long)local_34 * 8) != 0) {
        get((IDWNode *)CONCAT44(in_ESI,in_EDX),(uint)((ulong)in_RCX >> 0x20),(uint)in_RCX,in_R8,
            (float *)CONCAT44(fVar1,fVar2));
      }
    }
  }
  return;
}

Assistant:

void IDWNode::get(unsigned int _x, unsigned int _y, float &nominator, float &denominator) const
{
  const float xd=_x-xs;
  const float yd=_y-ys;
  float l2=xd*xd+yd*yd;

  // if individual value or is this node far away?

  if (n == 1 || l2 >= r2)
  {
    if (l2 > 0)
    {
      // interpolate from this node

      float v=w*n/l2;
      nominator+=v*f;
      denominator+=v;
    }
    else
    {
      // if requested coordinate matches coordinate of data value, then just
      // take the data value

      nominator=1e6f*f;
      denominator=1e6;
    }
  }
  else
  {
    // interpolate from all children individually

    for (int i=0; i<4; i++)
    {
      if (child[i] != 0)
      {
        child[i]->get(_x, _y, nominator, denominator);
      }
    }
  }
}